

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O3

void __thiscall bloaty::dwarf::AbbrevTable::ReadAbbrevs(AbbrevTable *this,string_view data)

{
  pointer *ppAVar1;
  char *out_str;
  char *buffer;
  bool bVar2;
  iterator __position;
  unsigned_short uVar3;
  mapped_type *pmVar4;
  Nonnull<char_*> pcVar5;
  string_view format;
  char *start;
  Arg *in_stack_fffffffffffffef8;
  uint local_fc;
  string_view local_f8;
  byte *local_e8;
  undefined8 local_e0;
  Nonnull<char_*> local_d8;
  char local_d0 [32];
  string local_b0;
  Arg local_90;
  Arg local_60;
  
  local_f8._M_str = data._M_str;
  local_f8._M_len = data._M_len;
  local_e8 = (byte *)local_f8._M_str;
  local_fc = ReadLEB128<unsigned_int>(&local_f8);
  if (local_fc != 0) {
    do {
      pmVar4 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev>,_std::allocator<std::pair<const_unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev>,_std::allocator<std::pair<const_unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_fc);
      if (pmVar4->code != 0) {
        Throw("DWARF data contained duplicate abbrev code",0x27);
      }
      pmVar4->code = local_fc;
      uVar3 = ReadLEB128<unsigned_short>(&local_f8);
      pmVar4->tag = uVar3;
      if (local_f8._M_len == 0) {
        Throw("premature EOF reading fixed-length data",0x8d);
      }
      bVar2 = (bool)*local_f8._M_str;
      local_f8._M_str = local_f8._M_str + 1;
      local_f8._M_len = local_f8._M_len - 1;
      if (1 < bVar2) {
        pcVar5 = absl::numbers_internal::FastIntToBuffer((uint)bVar2,local_d0);
        local_e0 = (long)pcVar5 - (long)local_d0;
        out_str = local_60.scratch_;
        local_d8 = local_d0;
        pcVar5 = absl::numbers_internal::FastIntToBuffer(pmVar4->code,out_str);
        local_60.piece_._M_len = (long)pcVar5 - (long)out_str;
        buffer = local_90.scratch_;
        local_60.piece_._M_str = out_str;
        pcVar5 = absl::numbers_internal::FastIntToBuffer((uint)pmVar4->tag,buffer);
        local_90.piece_._M_len = (long)pcVar5 - (long)buffer;
        format._M_str = (char *)&local_e0;
        format._M_len = (size_t)"DWARF has_child is neither true nor false: $0, code=$1, tag=$2";
        local_90.piece_._M_str = buffer;
        absl::Substitute_abi_cxx11_
                  (&local_b0,(absl *)0x3e,format,&local_60,&local_90,in_stack_fffffffffffffef8);
        Throw(local_b0._M_dataplus._M_p,0x39);
      }
      pmVar4->has_child = bVar2;
      uVar3 = ReadLEB128<unsigned_short>(&local_f8);
      local_e0 = CONCAT62(local_e0._2_6_,uVar3);
      uVar3 = ReadLEB128<unsigned_short>(&local_f8);
      local_e0._0_4_ = (Attribute)CONCAT22(uVar3,(uint16_t)local_e0);
      if ((uint16_t)local_e0 != 0 || uVar3 != 0) {
        do {
          if (uVar3 == 0x21) {
            ReadLEB128Internal(true,&local_f8);
          }
          __position._M_current =
               (pmVar4->attr).
               super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pmVar4->attr).
              super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<bloaty::dwarf::AbbrevTable::Attribute,std::allocator<bloaty::dwarf::AbbrevTable::Attribute>>
            ::_M_realloc_insert<bloaty::dwarf::AbbrevTable::Attribute_const&>
                      ((vector<bloaty::dwarf::AbbrevTable::Attribute,std::allocator<bloaty::dwarf::AbbrevTable::Attribute>>
                        *)&pmVar4->attr,__position,(Attribute *)&local_e0);
          }
          else {
            *__position._M_current = local_e0._0_4_;
            ppAVar1 = &(pmVar4->attr).
                       super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
          }
          uVar3 = ReadLEB128<unsigned_short>(&local_f8);
          local_e0 = CONCAT62(local_e0._2_6_,uVar3);
          uVar3 = ReadLEB128<unsigned_short>(&local_f8);
          local_e0._0_4_ = (Attribute)CONCAT22(uVar3,(uint16_t)local_e0);
        } while (uVar3 != 0 || (uint16_t)local_e0 != 0);
      }
      local_fc = ReadLEB128<unsigned_int>(&local_f8);
    } while (local_fc != 0);
  }
  (this->abbrev_data_)._M_len = (long)local_f8._M_str - (long)local_e8;
  (this->abbrev_data_)._M_str = (char *)local_e8;
  return;
}

Assistant:

void AbbrevTable::ReadAbbrevs(string_view data) {
  const char* start = data.data();
  while (true) {
    uint32_t code = ReadLEB128<uint32_t>(&data);

    if (code == 0) {
      abbrev_data_ = string_view(start, data.data() - start);
      return;
    }

    Abbrev& abbrev = abbrev_[code];

    if (abbrev.code) {
      THROW("DWARF data contained duplicate abbrev code");
    }

    uint8_t has_child;

    abbrev.code = code;
    abbrev.tag = ReadLEB128<uint16_t>(&data);
    has_child = ReadFixed<uint8_t>(&data);

    switch (has_child) {
      case DW_children_yes:
        abbrev.has_child = true;
        break;
      case DW_children_no:
        abbrev.has_child = false;
        break;
      default:
        THROWF("DWARF has_child is neither true nor false: $0, code=$1, tag=$2",
               has_child, abbrev.code, abbrev.tag);
    }

    while (true) {
      Attribute attr;
      attr.name = ReadLEB128<uint16_t>(&data);
      attr.form = ReadLEB128<uint16_t>(&data);

      if (attr.name == 0 && attr.form == 0) {
        break;  // End of this abbrev
      }
      if (attr.form == DW_FORM_implicit_const) {
        // We don't use the constant value, just discard it.
        ReadLEB128<int64_t>(&data);
      }
      abbrev.attr.push_back(attr);
    }
  }
}